

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

void __thiscall
Variable_addVariablesWithAndWithoutNameAndUnits_Test::TestBody
          (Variable_addVariablesWithAndWithoutNameAndUnits_Test *this)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  char *pcVar6;
  AssertHelper local_1d0 [8];
  Message local_1c8 [8];
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar;
  string a;
  PrinterPtr printer;
  string local_178 [32];
  undefined1 local_158 [8];
  UnitsPtr u;
  VariablePtr v4;
  VariablePtr v3;
  string local_120 [32];
  undefined1 local_100 [8];
  VariablePtr v2;
  string local_e8 [32];
  undefined1 local_c8 [8];
  VariablePtr v1;
  ComponentPtr c;
  string local_a0 [39];
  allocator<char> local_79;
  string local_78 [32];
  undefined1 local_58 [8];
  ModelPtr m;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string e;
  Variable_addVariablesWithAndWithoutNameAndUnits_Test *this_local;
  
  e.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_30,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n  <component>\n    <variable name=\"var1\" units=\"dimensionless\"/>\n    <variable name=\"var2\"/>\n    <variable units=\"dimensionless\"/>\n    <variable/>\n  </component>\n</model>\n"
             ,&local_31);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_78,"",&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a0,"",
             (allocator<char> *)
             ((long)&c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  createModelWithComponent((string *)local_58,local_78);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator(&local_79);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_58);
  libcellml::ComponentEntity::component
            ((ulong)&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount);
  libcellml::Variable::create();
  peVar2 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_e8,"var1",
             (allocator<char> *)
             ((long)&v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::NamedEntity::setName((string *)peVar2);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Variable::create();
  peVar2 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_100);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_120,"var2",
             (allocator<char> *)
             ((long)&v3.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::NamedEntity::setName((string *)peVar2);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&v3.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Variable::create();
  libcellml::Variable::create();
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Component::addVariable((shared_ptr *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Component::addVariable((shared_ptr *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Component::addVariable((shared_ptr *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Component::addVariable((shared_ptr *)peVar3);
  libcellml::Units::create();
  peVar4 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_178,"dimensionless",
             (allocator<char> *)
             ((long)&printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::NamedEntity::setName((string *)peVar4);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  peVar2 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_c8);
  libcellml::Variable::setUnits((shared_ptr *)peVar2);
  peVar2 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&v4.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  libcellml::Variable::setUnits((shared_ptr *)peVar2);
  libcellml::Printer::create();
  peVar5 = std::__shared_ptr_access<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)(a.field_2._M_local_buf + 8));
  libcellml::Printer::printModel_abi_cxx11_((shared_ptr *)&gtest_ar.message_,SUB81(peVar5,0));
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_1c0,"e","a",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar.message_
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar1) {
    testing::Message::Message(local_1c8);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
    testing::internal::AssertHelper::AssertHelper
              (local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x28c,pcVar6);
    testing::internal::AssertHelper::operator=(local_1d0,local_1c8);
    testing::internal::AssertHelper::~AssertHelper(local_1d0);
    testing::Message::~Message(local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  std::shared_ptr<libcellml::Printer>::~shared_ptr
            ((shared_ptr<libcellml::Printer> *)((long)&a.field_2 + 8));
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_158);
  std::shared_ptr<libcellml::Variable>::~shared_ptr
            ((shared_ptr<libcellml::Variable> *)
             &u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Variable>::~shared_ptr
            ((shared_ptr<libcellml::Variable> *)
             &v4.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_100);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_c8);
  std::shared_ptr<libcellml::Component>::~shared_ptr
            ((shared_ptr<libcellml::Component> *)
             &v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_58);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(Variable, addVariablesWithAndWithoutNameAndUnits)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component>\n"
        "    <variable name=\"var1\" units=\"dimensionless\"/>\n"
        "    <variable name=\"var2\"/>\n"
        "    <variable units=\"dimensionless\"/>\n"
        "    <variable/>\n"
        "  </component>\n"
        "</model>\n";

    libcellml::ModelPtr m = createModelWithComponent();
    libcellml::ComponentPtr c = m->component(0);
    libcellml::VariablePtr v1 = libcellml::Variable::create();
    v1->setName("var1");
    libcellml::VariablePtr v2 = libcellml::Variable::create();
    v2->setName("var2");
    libcellml::VariablePtr v3 = libcellml::Variable::create();
    libcellml::VariablePtr v4 = libcellml::Variable::create();

    c->addVariable(v1);
    c->addVariable(v2);
    c->addVariable(v3);
    c->addVariable(v4);

    libcellml::UnitsPtr u = libcellml::Units::create();
    u->setName("dimensionless");
    v1->setUnits(u);
    v3->setUnits(u);

    libcellml::PrinterPtr printer = libcellml::Printer::create();
    const std::string a = printer->printModel(m);
    EXPECT_EQ(e, a);
}